

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts5CreateTokenizer_v2
              (fts5_api *pApi,char *zName,void *pUserData,fts5_tokenizer_v2 *pTokenizer,
              _func_void_void_ptr *xDestroy)

{
  _func_int_void_ptr_char_ptr_ptr_int_Fts5Tokenizer_ptr_ptr *p_Var1;
  _func_int_Fts5Tokenizer_ptr_void_ptr_int_char_ptr_int_char_ptr_int__func_int_void_ptr_int_char_ptr_int_int_int_ptr
  *p_Var2;
  int iVar3;
  undefined4 uVar4;
  int iVar5;
  long in_FS_OFFSET;
  Fts5TokenizerModule *pNew;
  Fts5TokenizerModule *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  iVar5 = 1;
  if (pTokenizer->iVersion < 3) {
    local_20 = (Fts5TokenizerModule *)0x0;
    iVar5 = fts5NewTokenizerModule((Fts5Global *)pApi,zName,pUserData,xDestroy,&local_20);
    if (local_20 != (Fts5TokenizerModule *)0x0) {
      iVar3 = pTokenizer->iVersion;
      uVar4 = *(undefined4 *)&pTokenizer->field_0x4;
      p_Var1 = pTokenizer->xCreate;
      p_Var2 = pTokenizer->xTokenize;
      (local_20->x2).xDelete = pTokenizer->xDelete;
      (local_20->x2).xTokenize = p_Var2;
      (local_20->x2).iVersion = iVar3;
      *(undefined4 *)&(local_20->x2).field_0x4 = uVar4;
      (local_20->x2).xCreate = p_Var1;
      local_20->bV2Native = 1;
      (local_20->x1).xCreate = fts5VtoVCreate;
      (local_20->x1).xTokenize = fts5V1toV2Tokenize;
      (local_20->x1).xDelete = fts5VtoVDelete;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return iVar5;
  }
  __stack_chk_fail();
}

Assistant:

static int fts5CreateTokenizer_v2(
  fts5_api *pApi,                 /* Global context (one per db handle) */
  const char *zName,              /* Name of new function */
  void *pUserData,                /* User data for aux. function */
  fts5_tokenizer_v2 *pTokenizer,  /* Tokenizer implementation */
  void(*xDestroy)(void*)          /* Destructor for pUserData */
){
  Fts5Global *pGlobal = (Fts5Global*)pApi;
  int rc = SQLITE_OK;

  if( pTokenizer->iVersion>2 ){
    rc = SQLITE_ERROR;
  }else{
    Fts5TokenizerModule *pNew = 0;
    rc = fts5NewTokenizerModule(pGlobal, zName, pUserData, xDestroy, &pNew);
    if( pNew ){
      pNew->x2 = *pTokenizer;
      pNew->bV2Native = 1;
      pNew->x1.xCreate = fts5VtoVCreate;
      pNew->x1.xTokenize = fts5V1toV2Tokenize;
      pNew->x1.xDelete = fts5VtoVDelete;
    }
  }

  return rc;
}